

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

int spectest::LaneCountFromType(Type type)

{
  Enum EVar1;
  Type local_14;
  Type type_local;
  
  local_14 = type;
  EVar1 = wabt::Type::operator_cast_to_Enum(&local_14);
  switch(EVar1) {
  case I16:
    type_local.enum_ = ~(FuncRef|I32U);
    break;
  case I8:
    type_local.enum_ = ~ExternRef;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/spectest-interp.cc"
                  ,0xbd,"int spectest::LaneCountFromType(Type)");
  case F64:
    type_local.enum_ = ~F32;
    break;
  case F32:
    type_local.enum_ = I8U;
    break;
  case I64:
    type_local.enum_ = ~F32;
    break;
  case I32:
    type_local.enum_ = I8U;
  }
  return type_local.enum_;
}

Assistant:

int LaneCountFromType(Type type) {
  switch (type) {
    case Type::I8: return 16;
    case Type::I16: return 8;
    case Type::I32: return 4;
    case Type::I64: return 2;
    case Type::F32: return 4;
    case Type::F64: return 2;
    default: assert(false); return 0;
  }
}